

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O1

void __thiscall t_program::add_struct(t_program *this,t_struct *ts)

{
  pointer *ppptVar1;
  iterator iVar2;
  t_struct *local_10;
  
  iVar2._M_current =
       (this->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = ts;
  if (iVar2._M_current ==
      (this->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<t_struct*,std::allocator<t_struct*>>::_M_realloc_insert<t_struct*const&>
              ((vector<t_struct*,std::allocator<t_struct*>> *)&this->objects_,iVar2,&local_10);
  }
  else {
    *iVar2._M_current = ts;
    ppptVar1 = &(this->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  iVar2._M_current =
       (this->structs_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->structs_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<t_struct*,std::allocator<t_struct*>>::_M_realloc_insert<t_struct*const&>
              ((vector<t_struct*,std::allocator<t_struct*>> *)&this->structs_,iVar2,&local_10);
  }
  else {
    *iVar2._M_current = local_10;
    ppptVar1 = &(this->structs_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  return;
}

Assistant:

void add_struct(t_struct* ts) {
    objects_.push_back(ts);
    structs_.push_back(ts);
  }